

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

qsizetype __thiscall
QResourcePrivate::decompress(QResourcePrivate *this,char *buffer,qsizetype bufferSize)

{
  uLong uVar1;
  uint uVar2;
  int iVar3;
  uLong uVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  QMessageLogger local_48;
  uLong len;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0xffffffffffffffff;
  if (this->compressionAlgo == '\x02') {
    uVar4 = ZSTD_decompress(buffer,bufferSize,this->data,this->size);
    iVar3 = ZSTD_isError(uVar4);
    if (iVar3 != 0) {
      local_48.context.version = 2;
      local_48.context.function._4_4_ = 0;
      local_48.context._4_8_ = 0;
      local_48.context._12_8_ = 0;
      local_48.context.category = "default";
      uVar5 = ZSTD_getErrorName(uVar4);
      QMessageLogger::warning(&local_48,"QResource: error decompressing zstd content: %s",uVar5);
      uVar4 = uVar1;
    }
  }
  else {
    uVar4 = uVar1;
    if ((this->compressionAlgo == '\x01') &&
       (len = bufferSize, uVar2 = uncompress(buffer,&len,this->data + 4,this->size + -4),
       uVar4 = len, uVar2 != 0)) {
      local_48.context.version = 2;
      local_48.context.function._4_4_ = 0;
      local_48.context._4_8_ = 0;
      local_48.context._12_8_ = 0;
      local_48.context.category = "default";
      QMessageLogger::warning
                (&local_48,"QResource: error decompressing zlib content (%d)",(ulong)uVar2);
      uVar4 = uVar1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

qsizetype QResourcePrivate::decompress(char *buffer, qsizetype bufferSize) const
{
    Q_ASSERT(data);
#if defined(QT_NO_COMPRESS) && !QT_CONFIG(zstd)
    Q_UNUSED(buffer);
    Q_UNUSED(bufferSize);
#endif

    switch (compressionAlgo) {
    case QResource::NoCompression:
        Q_UNREACHABLE();
        break;

    case QResource::ZlibCompression: {
#ifndef QT_NO_COMPRESS
        uLong len = uLong(bufferSize);
        int res = ::uncompress(reinterpret_cast<Bytef *>(buffer), &len, data + sizeof(quint32),
                               uLong(size - sizeof(quint32)));
        if (res != Z_OK) {
            qWarning("QResource: error decompressing zlib content (%d)", res);
            return -1;
        }
        return len;
#else
        Q_UNREACHABLE();
#endif
    }

    case QResource::ZstdCompression: {
#if QT_CONFIG(zstd)
        size_t usize = ZSTD_decompress(buffer, bufferSize, data, size);
        if (ZSTD_isError(usize)) {
            qWarning("QResource: error decompressing zstd content: %s", ZSTD_getErrorName(usize));
            return -1;
        }
        return usize;
#else
        Q_UNREACHABLE();
#endif
    }
    }

    return -1;
}